

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_tracer.cc
# Opt level: O1

void webrtc::EventTracer::AddTraceEvent
               (char phase,uchar *category_enabled,char *name,unsigned_long_long id,int num_args,
               char **arg_names,uchar *arg_types,unsigned_long_long *arg_values,uchar flags)

{
  if ((anonymous_namespace)::g_add_trace_event_ptr != (code *)0x0) {
    (*(anonymous_namespace)::g_add_trace_event_ptr)((int)phase);
    return;
  }
  return;
}

Assistant:

void EventTracer::AddTraceEvent(char phase,
                                const unsigned char* category_enabled,
                                const char* name,
                                unsigned long long id,
                                int num_args,
                                const char** arg_names,
                                const unsigned char* arg_types,
                                const unsigned long long* arg_values,
                                unsigned char flags) {
  if (g_add_trace_event_ptr) {
    g_add_trace_event_ptr(phase,
                          category_enabled,
                          name,
                          id,
                          num_args,
                          arg_names,
                          arg_types,
                          arg_values,
                          flags);
  }
}